

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::init
          (ConcurrentAtomicCounterCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  RenderContext *pRVar2;
  int iVar3;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *pSVar5;
  ProgramSources *pPVar6;
  TestError *pTVar7;
  allocator<char> local_161;
  ScopedLogSection section;
  undefined1 local_158 [40];
  string local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  ProgramSources local_f8;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  local_f8.sources[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&zeroData,(long)(this->m_workSize * this->m_numCalls),(value_type_conflict4 *)&local_f8
             ,(allocator_type *)local_158);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_counterBuffer);
  (**(code **)(lVar4 + 0x40))(0x90d2,this->m_counterBuffer);
  (**(code **)(lVar4 + 0x150))
            (0x90d2,4,zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,0x88ea);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_intermediateResultBuffer);
  (**(code **)(lVar4 + 0x40))(0x90d2,this->m_intermediateResultBuffer);
  (**(code **)(lVar4 + 0x150))
            (0x90d2,(long)this->m_workSize * (long)this->m_numCalls * 4,
             zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88ea);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"gen buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x97b);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"EvenProgram",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_158,"Even program",&local_161);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&local_f8,(string *)local_158);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)&local_f8);
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  Functional::(anonymous_namespace)::ConcurrentAtomicCounterCase::genComputeSource_abi_cxx11_
            (&local_130,this,true);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_158,&local_130);
  pPVar6 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_158);
  glu::ShaderProgram::ShaderProgram(pSVar5,pRVar2,pPVar6);
  this->m_evenProgram = pSVar5;
  std::__cxx11::string::~string((string *)(local_158 + 8));
  std::__cxx11::string::~string((string *)&local_130);
  glu::ProgramSources::~ProgramSources(&local_f8);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_evenProgram);
  if ((this->m_evenProgram->m_program).m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"could not build program",(allocator<char> *)local_158);
    tcu::TestError::TestError(pTVar7,(string *)&local_f8);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"OddProgram",(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_158,"Odd program",&local_161);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)&local_f8,(string *)local_158);
  std::__cxx11::string::~string((string *)local_158);
  std::__cxx11::string::~string((string *)&local_f8);
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  Functional::(anonymous_namespace)::ConcurrentAtomicCounterCase::genComputeSource_abi_cxx11_
            (&local_130,this,false);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_158,&local_130);
  pPVar6 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_158);
  glu::ShaderProgram::ShaderProgram(pSVar5,pRVar2,pPVar6);
  this->m_oddProgram = pSVar5;
  std::__cxx11::string::~string((string *)(local_158 + 8));
  std::__cxx11::string::~string((string *)&local_130);
  glu::ProgramSources::~ProgramSources(&local_f8);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_oddProgram);
  if ((this->m_oddProgram->m_program).m_info.linkOk != false) {
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&zeroData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return extraout_EAX;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"could not build program",(allocator<char> *)local_158);
  tcu::TestError::TestError(pTVar7,(string *)&local_f8);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConcurrentAtomicCounterCase::init (void)
{
	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const std::vector<deUint32>	zeroData	(m_numCalls * m_workSize, 0);

	// gen buffer

	gl.genBuffers(1, &m_counterBuffer);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_counterBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32), &zeroData[0], GL_DYNAMIC_COPY);

	gl.genBuffers(1, &m_intermediateResultBuffer);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32) * m_numCalls * m_workSize, &zeroData[0], GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");

	// gen programs

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "EvenProgram", "Even program");

		m_evenProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(true)));
		m_testCtx.getLog() << *m_evenProgram;
		if (!m_evenProgram->isOk())
			throw tcu::TestError("could not build program");
	}
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "OddProgram", "Odd program");

		m_oddProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(false)));
		m_testCtx.getLog() << *m_oddProgram;
		if (!m_oddProgram->isOk())
			throw tcu::TestError("could not build program");
	}
}